

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::DeleteMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key)

{
  bool bVar1;
  MapFieldBase *this_00;
  MapKey *key_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = anon_unknown_6::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"DeleteMapValue","Field is not a map field.");
  }
  this_00 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  bVar1 = internal::MapFieldBase::DeleteMapValue(this_00,key);
  return bVar1;
}

Assistant:

bool Reflection::DeleteMapValue(Message* message, const FieldDescriptor* field,
                                const MapKey& key) const {
  USAGE_CHECK(IsMapFieldInApi(field), DeleteMapValue,
              "Field is not a map field.");
  return MutableRaw<MapFieldBase>(message, field)->DeleteMapValue(key);
}